

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot_landscapes.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  Persistence_landscape l;
  
  poVar1 = std::operator<<((ostream *)&std::clog,
                           "This program creates a gnuplot script from a persistence landscape stored in a file (the file needs "
                          );
  std::operator<<(poVar1,
                  "to be created beforehand). Please call the code with the name of a single landscape file.\n"
                 );
  if (argc != 2) {
    std::operator<<((ostream *)&std::clog,"Wrong parameter list, the program will now terminate \n")
    ;
  }
  else {
    l.land.
    super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    l.number_of_functions_for_vectorization = 0;
    l.land.
    super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    l.land.
    super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    l.number_of_functions_for_projections_to_reals = 0;
    Gudhi::Persistence_representations::Persistence_landscape::load_landscape_from_file(&l,argv[1]);
    Gudhi::Persistence_representations::Persistence_landscape::plot
              (&l,argv[1],1.79769313486232e+308,1.79769313486232e+308,1.79769313486232e+308,
               1.79769313486232e+308,0x7fffffff,0x7fffffff);
    std::
    vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
    ::~vector(&l.land);
  }
  return (uint)(argc != 2);
}

Assistant:

int main(int argc, char** argv) {
  std::clog << "This program creates a gnuplot script from a persistence landscape stored in a file (the file needs "
            << "to be created beforehand). Please call the code with the name of a single landscape file.\n";
  if (argc != 2) {
    std::clog << "Wrong parameter list, the program will now terminate \n";
    return 1;
  }

  Persistence_landscape l;
  l.load_landscape_from_file(argv[1]);
  l.plot(argv[1]);

  return 0;
}